

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O2

MetadataResult __thiscall
duckdb_shell::ShellState::DisplayEntries(ShellState *this,char **azArg,idx_t nArg,char type)

{
  char *pcVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  char *pcVar12;
  char *pcVar13;
  MetadataResult MVar14;
  ulong local_90;
  sqlite3_stmt *pStmt;
  long local_78;
  void *local_70;
  long local_68;
  uint local_5c;
  long local_58;
  string s;
  
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  OpenDB(this,0);
  MVar14 = PRINT_USAGE;
  if (nArg < 3) {
    appendText(&s,"SELECT name FROM ",'\0');
    appendText(&s,"sqlite_schema ",'\0');
    pcVar12 = " WHERE type=\'index\'   AND tbl_name LIKE ?1";
    if (type == 't') {
      pcVar12 = 
      " WHERE type IN (\'table\',\'view\')   AND name NOT LIKE \'sqlite_%\'   AND name LIKE ?1";
    }
    appendText(&s,pcVar12,'\0');
    appendText(&s," ORDER BY 1",'\0');
    iVar4 = duckdb_shell_sqlite3_prepare_v2(this->db,s._M_dataplus._M_p,-1,&pStmt,(char **)0x0);
    MVar14 = FAIL;
    if (iVar4 == 0) {
      if (nArg == 2) {
        duckdb_shell_sqlite3_bind_text
                  (pStmt,1,azArg[1],-1,(_func_void_void_ptr *)0xffffffffffffffff);
      }
      else {
        duckdb_shell_sqlite3_bind_text(pStmt,1,"%",-1,(_func_void_void_ptr *)0x0);
      }
      iVar11 = 1;
      local_68 = 0;
      lVar9 = 0;
      iVar4 = 0;
      pvVar6 = (void *)0x0;
      while (iVar5 = duckdb_shell_sqlite3_step(pStmt), iVar5 == 100) {
        if (iVar4 <= lVar9) {
          pvVar6 = duckdb_shell_sqlite3_realloc64(pvVar6,(long)(iVar4 * 2) * 8 + 0x50);
          if (pvVar6 == (void *)0x0) goto LAB_001e630b;
          iVar4 = iVar4 * 2 + 10;
        }
        duckdb_shell_sqlite3_column_text(pStmt,0);
        pcVar12 = duckdb_shell_sqlite3_mprintf("%s");
        *(char **)((long)pvVar6 + lVar9 * 8) = pcVar12;
        if (pcVar12 == (char *)0x0) {
LAB_001e630b:
          shell_out_of_memory();
        }
        lVar9 = lVar9 + 1;
        iVar11 = iVar11 + -1;
        local_68 = local_68 + 0x100000000;
      }
      local_78 = lVar9;
      local_70 = pvVar6;
      iVar4 = duckdb_shell_sqlite3_finalize(pStmt);
      pvVar6 = local_70;
      lVar9 = local_78;
      if (iVar4 == 0) {
        if (local_78 != 0) {
          local_90 = 0;
          for (lVar10 = 0; uVar8 = (uint)local_90, lVar9 != lVar10; lVar10 = lVar10 + 1) {
            uVar7 = strlen(*(char **)((long)pvVar6 + lVar10 * 8));
            if ((int)uVar7 < (int)uVar8) {
              uVar7 = local_90;
            }
            local_90 = uVar7 & 0xffffffff;
          }
          uVar2 = 1;
          if (uVar8 < 0x4f) {
            uVar2 = (uint)(0x50 / (ulong)(uVar8 + 2));
          }
          local_5c = (uVar2 - iVar11) / uVar2;
          local_68 = local_68 >> 0x20;
          lVar9 = (long)(int)local_5c;
          lVar10 = 0;
          while (lVar3 = lVar10, (int)lVar10 < (int)local_5c) {
            for (; local_58 = lVar3, lVar10 < local_68;
                lVar10 = lVar10 + (int)((uVar2 - iVar11) / uVar2)) {
              pcVar12 = anon_var_dwarf_4b71df5 + 9;
              if (lVar9 <= lVar10) {
                pcVar12 = "  ";
              }
              pcVar1 = *(char **)((long)local_70 + lVar10 * 8);
              pcVar13 = anon_var_dwarf_4b71df5 + 9;
              if (pcVar1 != (char *)0x0) {
                pcVar13 = pcVar1;
              }
              fprintf((FILE *)this->out,"%s%-*s",pcVar12,local_90,pcVar13);
              lVar3 = local_58;
            }
            fputc(10,(FILE *)this->out);
            lVar10 = local_58 + 1;
          }
        }
      }
      else {
        ShellDatabaseError(this,this->db);
      }
      pvVar6 = local_70;
      lVar9 = local_78;
      for (lVar10 = 0; lVar9 != lVar10; lVar10 = lVar10 + 1) {
        duckdb_shell_sqlite3_free(*(void **)((long)pvVar6 + lVar10 * 8));
      }
      duckdb_shell_sqlite3_free(pvVar6);
      MVar14 = iVar4 != 0;
    }
  }
  std::__cxx11::string::~string((string *)&s);
  return MVar14;
}

Assistant:

MetadataResult ShellState::DisplayEntries(const char **azArg, idx_t nArg, char type) {
	sqlite3_stmt *pStmt;
	char **azResult;
	int nRow, nAlloc;
	int ii;
	string s;
	OpenDB(0);
	//    rc = sqlite3_prepare_v2(db, "PRAGMA database_list", -1, &pStmt, 0);
	//    if( rc ){
	//      sqlite3_finalize(pStmt);
	//      return shellDatabaseError(db);
	//    }

	if (nArg > 2) {
		return MetadataResult::PRINT_USAGE;
	}
	//    for(ii=0; sqlite3_step(pStmt)==SQLITE_ROW; ii++){
	//      const char *zDbName = (const char*)sqlite3_column_text(pStmt, 1);
	//      if( zDbName==0 ) continue;
	//      if( s.z && s.z[0] ) appendText(&s, " UNION ALL ", 0);
	appendText(s, "SELECT name FROM ", 0);
	//      appendText(&s, zDbName, '"');
	appendText(s, "sqlite_schema ", 0);
	if (type == 't') {
		appendText(s,
		           " WHERE type IN ('table','view')"
		           "   AND name NOT LIKE 'sqlite_%'"
		           "   AND name LIKE ?1",
		           0);
	} else {
		appendText(s,
		           " WHERE type='index'"
		           "   AND tbl_name LIKE ?1",
		           0);
	}
	//    }
	//    rc = sqlite3_finalize(pStmt);
	appendText(s, " ORDER BY 1", 0);
	int rc = sqlite3_prepare_v2(db, s.c_str(), -1, &pStmt, 0);
	if (rc) {
		return MetadataResult::FAIL;
	}

	/* Run the SQL statement prepared by the above block. Store the results
	** as an array of nul-terminated strings in azResult[].  */
	nRow = nAlloc = 0;
	azResult = nullptr;
	if (nArg > 1) {
		sqlite3_bind_text(pStmt, 1, azArg[1], -1, SQLITE_TRANSIENT);
	} else {
		sqlite3_bind_text(pStmt, 1, "%", -1, SQLITE_STATIC);
	}
	while (sqlite3_step(pStmt) == SQLITE_ROW) {
		if (nRow >= nAlloc) {
			char **azNew;
			int n2 = nAlloc * 2 + 10;
			azNew = (char **)sqlite3_realloc64(azResult, sizeof(azResult[0]) * n2);
			if (azNew == 0)
				shell_out_of_memory();
			nAlloc = n2;
			azResult = azNew;
		}
		azResult[nRow] = sqlite3_mprintf("%s", sqlite3_column_text(pStmt, 0));
		if (0 == azResult[nRow])
			shell_out_of_memory();
		nRow++;
	}
	if (sqlite3_finalize(pStmt) != SQLITE_OK) {
		rc = ShellDatabaseError(db);
	}

	/* Pretty-print the contents of array azResult[] to the output */
	if (rc == 0 && nRow > 0) {
		int len, maxlen = 0;
		int i, j;
		int nPrintCol, nPrintRow;
		for (i = 0; i < nRow; i++) {
			len = StringLength(azResult[i]);
			if (len > maxlen)
				maxlen = len;
		}
		nPrintCol = 80 / (maxlen + 2);
		if (nPrintCol < 1)
			nPrintCol = 1;
		nPrintRow = (nRow + nPrintCol - 1) / nPrintCol;
		for (i = 0; i < nPrintRow; i++) {
			for (j = i; j < nRow; j += nPrintRow) {
				const char *zSp = j < nPrintRow ? "" : "  ";
				utf8_printf(out, "%s%-*s", zSp, maxlen, azResult[j] ? azResult[j] : "");
			}
			raw_printf(out, "\n");
		}
	}

	for (ii = 0; ii < nRow; ii++) {
		sqlite3_free(azResult[ii]);
	}
	sqlite3_free(azResult);
	return rc == 0 ? MetadataResult::SUCCESS : MetadataResult::FAIL;
}